

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::Geobucket<4UL>::Geobucket
          (Geobucket<4UL> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight)

{
  MOGrlex<137UL> *oRight;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_RSI;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_RDI;
  Geobucket<4UL> *unaff_retaddr;
  size_type in_stack_ffffffffffffffd8;
  vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
  *in_stack_ffffffffffffffe0;
  MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight_00;
  
  polyRight_00 = in_RDI;
  std::
  vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
  ::vector((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
            *)0x1afc65);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afc78);
  std::
  vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
  ::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  oRight = (MOGrlex<137UL> *)
           std::
           vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
           ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                         *)in_RDI,0);
  GetOrder(in_RSI);
  SetOrder(in_RDI,oRight);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             (value_type_conflict1 *)oRight);
  SymDiffSplice(unaff_retaddr,polyRight_00);
  return;
}

Assistant:

Geobucket(MP& polyRight)
		{
			_buckets.resize(1);
			_buckets[0].SetOrder(polyRight.GetOrder());
			_maxsizes.push_back(_d);
			SymDiffSplice(polyRight);
		}